

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
::find_soo<google::protobuf::FileDescriptor_const*>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
           *this,key_arg<const_google::protobuf::FileDescriptor_*> *key)

{
  slot_type *ppFVar1;
  anon_union_8_1_a8a14541_for_iterator_2 aVar2;
  undefined1 *puVar3;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  iterator iVar4;
  
  if (*(long *)this != 1) {
    if (*(long *)this == 0) {
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                   );
    }
    __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe21,
                  "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<const google::protobuf::FileDescriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, K = const google::protobuf::FileDescriptor *]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)this);
  if (1 < *(ulong *)(this + 8)) {
    ppFVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          *)this);
    if (*ppFVar1 == *key) {
      aVar2.slot_ = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                *)this);
      puVar3 = kSooControl;
      goto LAB_001a4cfb;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)this);
  puVar3 = (ctrl_t *)0x0;
  aVar2 = extraout_RDX;
LAB_001a4cfb:
  iVar4.field_1.slot_ = aVar2.slot_;
  iVar4.ctrl_ = puVar3;
  return iVar4;
}

Assistant:

size_t capacity() const { return capacity_; }